

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_fail.cpp
# Opt level: O0

void __thiscall tst_qpromise_fail::baseClass(tst_qpromise_fail *this)

{
  QString local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QString *local_a0;
  QPromiseBase<int> local_98;
  QPromiseBase<int> local_88;
  QPromiseBase<int> local_78;
  QPromiseBase<int> local_68;
  undefined1 local_58 [8];
  QString error;
  out_of_range local_30 [16];
  undefined1 local_20 [8];
  QPromise<int> p;
  tst_qpromise_fail *this_local;
  
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  std::out_of_range::out_of_range(local_30,"foo");
  QtPromise::QPromiseBase<int>::reject<std::out_of_range>((QPromiseBase<int> *)local_20,local_30);
  std::out_of_range::~out_of_range(local_30);
  QString::QString((QString *)local_58);
  local_a0 = (QString *)local_58;
  QtPromise::QPromiseBase<int>::fail<tst_qpromise_fail::baseClass()::__0>
            (&local_98,(anon_class_8_1_a7dec128 *)local_20);
  local_a8 = local_58;
  QtPromise::QPromiseBase<int>::fail<tst_qpromise_fail::baseClass()::__1>
            (&local_88,(anon_class_8_1_a7dec128 *)&local_98);
  local_b0 = local_58;
  QtPromise::QPromiseBase<int>::fail<tst_qpromise_fail::baseClass()::__2>
            (&local_78,(anon_class_8_1_a7dec128 *)&local_88);
  QtPromise::QPromiseBase<int>::wait(&local_68,&local_78);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_68);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_78);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_88);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_98);
  QString::QString(&local_c8,"foo1");
  QTest::qCompare((QString *)local_58,&local_c8,"error","QString{\"foo1\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_fail.cpp"
                  ,0x71);
  QString::~QString(&local_c8);
  QString::~QString((QString *)local_58);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_qpromise_fail::baseClass()
{
    // http://en.cppreference.com/w/cpp/error/exception
    auto p = QtPromise::QPromise<int>::reject(std::out_of_range("foo"));

    QString error;
    p.fail([&](const std::runtime_error& e) {
         error += QString{e.what()} + "0";
         return -1;
     })
        .fail([&](const std::logic_error& e) {
            error += QString{e.what()} + "1";
            return -1;
        })
        .fail([&](const std::exception& e) {
            error += QString{e.what()} + "2";
            return -1;
        })
        .wait();

    QCOMPARE(error, QString{"foo1"});
}